

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9IsoNpn(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_40;
  int fVerbose;
  int c;
  Vec_Ptr_t *vPosEquivs;
  Gia_Man_t *pAig;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_40 = 0;
  pAig = (Gia_Man_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argv_local._4_4_,&pAig->pName,"vh");
    if (iVar1 == -1) {
      if (pAStack_18->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9IsoNpn(): There is no AIG.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        iVar1 = Gia_ManPoNum(pAStack_18->pGia);
        if (iVar1 == 1) {
          Abc_Print(-1,
                    "Abc_CommandAbc9IsoNpn(): The AIG has only one PO. Isomorphism detection is not performed.\n"
                   );
          pAbc_local._4_4_ = 1;
        }
        else {
          iVar1 = Gia_ManRegNum(pAStack_18->pGia);
          if (iVar1 == 0) {
            vPosEquivs = (Vec_Ptr_t *)
                         Gia_ManIsoNpnReduce(pAStack_18->pGia,(Vec_Ptr_t **)&fVerbose,local_40);
            if ((Gia_Man_t *)vPosEquivs == (Gia_Man_t *)0x0) {
              Abc_Print(-1,"Abc_CommandAbc9IsoNpn(): Transformation has failed.\n");
              pAbc_local._4_4_ = 1;
            }
            else {
              Abc_FrameReplacePoEquivs(pAStack_18,(Vec_Ptr_t **)&fVerbose);
              Abc_FrameUpdateGia(pAStack_18,(Gia_Man_t *)vPosEquivs);
              pAbc_local._4_4_ = 0;
            }
          }
          else {
            Abc_Print(-1,"Abc_CommandAbc9IsoNpn(): ISO-NPN does not work with sequential AIGs.\n");
            pAbc_local._4_4_ = 1;
          }
        }
      }
      return pAbc_local._4_4_;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) break;
    local_40 = local_40 ^ 1;
  }
  Abc_Print(-2,"usage: &isonpn [-vh]\n");
  Abc_Print(-2,"\t         removes POs with functionally isomorphic combinational COI\n");
  Abc_Print(-2,"\t         (currently ignores POs whose structural support is more than 16)\n");
  pcVar2 = "no";
  if (local_40 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9IsoNpn( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManIsoNpnReduce( Gia_Man_t * p, Vec_Ptr_t ** pvPosEquivs, int fVerbose );
    Gia_Man_t * pAig;
    Vec_Ptr_t * vPosEquivs;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9IsoNpn(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManPoNum(pAbc->pGia) == 1 )
    {
        Abc_Print( -1, "Abc_CommandAbc9IsoNpn(): The AIG has only one PO. Isomorphism detection is not performed.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9IsoNpn(): ISO-NPN does not work with sequential AIGs.\n" );
        return 1;
    }
    pAig = Gia_ManIsoNpnReduce( pAbc->pGia, &vPosEquivs, fVerbose );
    if ( pAig == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9IsoNpn(): Transformation has failed.\n" );
        return 1;
    }
    // update the internal storage of PO equivalences
    Abc_FrameReplacePoEquivs( pAbc, &vPosEquivs );
    // update the AIG
    Abc_FrameUpdateGia( pAbc, pAig );
    return 0;

usage:
    Abc_Print( -2, "usage: &isonpn [-vh]\n" );
    Abc_Print( -2, "\t         removes POs with functionally isomorphic combinational COI\n" );
    Abc_Print( -2, "\t         (currently ignores POs whose structural support is more than 16)\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}